

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O1

string * __thiscall
cppcms::http::context::skin_abi_cxx11_(string *__return_storage_ptr__,context *this)

{
  _data *p_Var1;
  pointer pcVar2;
  
  p_Var1 = (this->d).ptr_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (p_Var1->skin)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (p_Var1->skin)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string context::skin()
{
	return d->skin;
}